

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadIdentifier(AsciiParser *this,string *token)

{
  bool bVar1;
  int iVar2;
  string local_1d8 [39];
  char local_1b1 [8];
  char c_1;
  stringstream local_1a8 [7];
  char c;
  stringstream ss;
  ostream aoStack_198 [376];
  string *local_20;
  string *token_local;
  AsciiParser *this_local;
  
  local_20 = token;
  token_local = (string *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = Char1(this,&c_1);
  if (bVar1) {
    if ((c_1 == '_') || (iVar2 = isalpha((int)c_1), iVar2 != 0)) {
      (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
      ::std::operator<<(aoStack_198,c_1);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = Char1(this,local_1b1);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0060ec08;
        }
        if ((local_1b1[0] != '_') && (iVar2 = isalnum((int)local_1b1[0]), iVar2 == 0)) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
        ::std::operator<<(aoStack_198,local_1b1[0]);
      }
      ::std::__cxx11::stringstream::str();
      ::std::__cxx11::string::operator=((string *)local_20,local_1d8);
      ::std::__cxx11::string::~string(local_1d8);
      this_local._7_1_ = 1;
    }
    else {
      StreamReader::seek_from_current(this->_sr,-1);
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0060ec08:
  local_1b1[1] = '\x01';
  local_1b1[2] = '\0';
  local_1b1[3] = '\0';
  local_1b1[4] = '\0';
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadIdentifier(std::string *token) {
  // identifier = (`_` | [a-zA-Z]) (`_` | [a-zA-Z0-9]+)
  std::stringstream ss;

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      DCOUT("read1 failed.");
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalpha(int(c))) {
      DCOUT(fmt::format("Invalid identiefier: '{}'", c));
      _sr->seek_from_current(-1);
      return false;
    }
    _curr_cursor.col++;

    ss << c;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalnum(int(c))) {
      _sr->seek_from_current(-1);
      break;  // end of identifier(e.g. ' ')
    }

    _curr_cursor.col++;

    ss << c;
  }

  (*token) = ss.str();
  return true;
}